

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_routine.cpp
# Opt level: O1

stCoEpoll_t * AllocEpoll(void)

{
  int iVar1;
  stCoEpoll_t *psVar2;
  stTimeout_t *psVar3;
  stTimeoutItemLink_t *psVar4;
  
  psVar2 = (stCoEpoll_t *)calloc(1,0x28);
  iVar1 = co_epoll_create(0x2800);
  psVar2->iEpollFd = iVar1;
  psVar3 = AllocTimeout(60000);
  psVar2->pTimeout = psVar3;
  psVar4 = (stTimeoutItemLink_t *)calloc(1,0x10);
  psVar2->pstActiveList = psVar4;
  psVar4 = (stTimeoutItemLink_t *)calloc(1,0x10);
  psVar2->pstTimeoutList = psVar4;
  return psVar2;
}

Assistant:

stCoEpoll_t *AllocEpoll()
{
	stCoEpoll_t *ctx = (stCoEpoll_t*)calloc( 1,sizeof(stCoEpoll_t) );

	ctx->iEpollFd = co_epoll_create( stCoEpoll_t::_EPOLL_SIZE );
	ctx->pTimeout = AllocTimeout( 60 * 1000 );
	
	ctx->pstActiveList = (stTimeoutItemLink_t*)calloc( 1,sizeof(stTimeoutItemLink_t) );
	ctx->pstTimeoutList = (stTimeoutItemLink_t*)calloc( 1,sizeof(stTimeoutItemLink_t) );


	return ctx;
}